

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O3

optional<unsigned_long> __thiscall
tsbp::TwoStepBranchingProcedure::Branch(TwoStepBranchingProcedure *this,size_t nodeId)

{
  StoredVertexList *pSVar1;
  ulong *puVar2;
  int iVar3;
  __uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_> _Var4;
  pointer psVar5;
  int *piVar6;
  iterator iVar7;
  TwoStepBranchingProcedure *this_00;
  bool bVar8;
  undefined1 *puVar9;
  pointer psVar10;
  void *pvVar11;
  ulong uVar12;
  pointer psVar13;
  int *piVar14;
  StoredVertexList *pSVar15;
  _Storage<unsigned_long,_true> _Var16;
  _Storage<unsigned_long,_true> _Var17;
  _Storage<unsigned_long,_true> _Var18;
  _Storage<unsigned_long,_true> unaff_R14;
  optional<unsigned_long> oVar19;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar20;
  vertex_descriptor leftNodeId_1;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> attemptedItemIds;
  vertex_descriptor leftNodeId;
  _Storage<unsigned_long,_true> local_98;
  _Storage<unsigned_long,_true> local_90;
  void *local_88;
  undefined1 local_80 [16];
  _Storage<unsigned_long,_true> local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined1 local_60 [8];
  _Storage<unsigned_long,_true> local_58;
  StoredVertexList *local_50;
  TwoStepBranchingProcedure *local_48;
  _Storage<unsigned_long,_true> local_40;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  psVar10 = (this->tree).super_type.m_vertices.
            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (*(Status *)((long)&psVar10[nodeId].super_StoredVertex.m_property.super_BaseNode + 8) !=
      InfeasibleSequence) {
    pSVar1 = &(this->tree).super_type.m_vertices;
    _Var4._M_t.
    super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>.
    super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl =
         psVar10[nodeId].super_StoredVertex.m_property.Packing._M_t.
         super___uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
         ._M_t;
    unaff_R14._M_value =
         (long)*(pointer *)
                ((long)&psVar10[nodeId].super_StoredVertex.m_out_edges.
                        super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
                + 8) -
         *(long *)&psVar10[nodeId].super_StoredVertex.m_out_edges.
                   super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
         >> 4;
    local_38 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)_Var4._M_t.
                      super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
                      .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 0x38);
    local_58 = (_Storage<unsigned_long,_true>)nodeId;
    puVar9 = (undefined1 *)
             boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(local_38);
    if ((undefined1 *)unaff_R14._M_value != puVar9) {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_90,
                 (long)(this->items).
                       super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(this->items).
                       super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl
                       .super__Vector_impl_data._M_start >> 5,0,
                 (allocator<unsigned_long> *)&local_70);
      psVar10 = (pSVar1->
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                )._M_impl.super__Vector_impl_data._M_start;
      psVar5 = *(pointer *)
                ((long)&psVar10[nodeId].super_StoredVertex.m_out_edges.
                        super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
                + 8);
      for (psVar13 = *(pointer *)
                      &psVar10[nodeId].super_StoredVertex.m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
          ; psVar13 != psVar5; psVar13 = psVar13 + 1) {
        iVar3 = psVar10[(psVar13->super_stored_edge<unsigned_long>).m_target].super_StoredVertex.
                m_property.super_BaseNode.ItemIdToPlace;
        uVar12 = (ulong)iVar3;
        if (-1 < (long)uVar12) {
          if ((ulong)local_80._8_8_ <= uVar12) {
            __assert_fail("pos < m_num_bits","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",
                          0x40b,
                          "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::set(size_type, bool) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                         );
          }
          puVar2 = (ulong *)(local_90._M_value + (uVar12 >> 6) * 8);
          *puVar2 = *puVar2 | 1L << ((byte)iVar3 & 0x3f);
        }
      }
      piVar14 = (this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar6 = (this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_40 = (_Storage<unsigned_long,_true>)nodeId;
      if (piVar14 != piVar6) {
        local_50 = pSVar1;
        local_48 = this;
        do {
          iVar3 = *piVar14;
          unaff_R14 = (_Storage<unsigned_long,_true>)(long)iVar3;
          bVar8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                             ((long)_Var4._M_t.
                                    super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
                                    .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>.
                                    _M_head_impl + 0x18),unaff_R14._M_value);
          if (((!bVar8) &&
              ((*(ulong *)(local_90._M_value + (unaff_R14._M_value >> 6) * 8) >>
                (unaff_R14._M_value & 0x3f) & 1) == 0)) &&
             (bVar8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                                (local_38,unaff_R14._M_value), this_00 = local_48, bVar8)) {
            _Var16._M_value =
                 ((long)(local_48->tree).super_type.m_vertices.
                        super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_48->tree).super_type.m_vertices.
                        super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
            local_70._M_value._4_4_ = 0;
            local_68 = 2;
            local_98._M_value = _Var16._M_value;
            local_70._M_value._0_4_ = iVar3;
            std::make_unique<tsbp::PackingRelaxed2D,tsbp::PackingRelaxed2D_const&>
                      ((PackingRelaxed2D *)local_60);
            AddLeafNode(this_00,(Node *)&local_70);
            std::unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>::
            ~unique_ptr((unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
                         *)local_60);
            pSVar1 = local_50;
            _Var17 = local_40;
            if (local_40._M_value <= _Var16._M_value) {
              _Var17._M_value = _Var16._M_value;
            }
            psVar10 = (this_00->tree).super_type.m_vertices.
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pSVar15 = (StoredVertexList *)0xaaaaaaaaaaaaaaab;
            if ((undefined1 *)
                (((long)(this_00->tree).super_type.m_vertices.
                        super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar10 >> 4) *
                -0x5555555555555555) <= _Var17._M_value) {
              std::
              vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ::resize(local_50,(size_type)(_Var17._M_value + 1));
              psVar10 = (pSVar1->
                        super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              pSVar15 = pSVar1;
            }
            local_70._M_value = _Var16._M_value;
            pvVar11 = operator_new(1);
            local_68 = SUB84(pvVar11,0);
            uStack_64 = (undefined4)((ulong)pvVar11 >> 0x20);
            std::
            vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>
            ::emplace_back<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>
                      ((vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>
                        *)(psVar10 + nodeId),
                       (stored_edge_property<unsigned_long,_boost::no_property> *)&local_70);
            if ((void *)CONCAT44(uStack_64,local_68) != (void *)0x0) {
              operator_delete((void *)CONCAT44(uStack_64,local_68),1);
            }
            iVar7._M_current =
                 (this_00->activeNodes).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (this_00->activeNodes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                         &this_00->activeNodes,iVar7,&local_98._M_value);
            }
            else {
              *iVar7._M_current = (unsigned_long)local_98;
              (this_00->activeNodes).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar7._M_current + 1;
            }
            uVar12 = CONCAT71((int7)((ulong)pSVar15 >> 8),1);
            unaff_R14 = local_98;
            goto LAB_00123e62;
          }
          piVar14 = piVar14 + 1;
        } while (piVar14 != piVar6);
      }
      uVar12 = 0;
LAB_00123e62:
      bVar8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &local_90);
      if (!bVar8) {
        __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",
                      0x2be,
                      "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                     );
      }
      if ((void *)local_90._M_value != (void *)0x0) {
        operator_delete((void *)local_90,local_80._0_8_ - (long)local_90);
      }
      goto LAB_00123cf9;
    }
    unaff_R14._M_value = (unsigned_long)&this->nodesToDeactivate;
    pVar20 = std::
             _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             ::_M_emplace<unsigned_long&>
                       ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                         *)unaff_R14._M_value,&local_58);
    if (*(Status *)((long)&psVar10[nodeId].super_StoredVertex.m_property.super_BaseNode + 8) == Root
       ) {
      local_90._M_value = local_90._M_value & 0xffffffff00000000;
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_emplace<int>((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)unaff_R14._M_value,&local_90,pVar20._8_8_);
    }
    else if (*(Type *)((long)&psVar10[nodeId].super_StoredVertex.m_property.super_BaseNode + 4) !=
             DeactivatePlacement) {
      _Var18._M_value =
           ((long)(this->tree).super_type.m_vertices.
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->tree).super_type.m_vertices.
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      local_90._M_value = 0x1ffffffff;
      local_88 = (void *)CONCAT44(local_88._4_4_,2);
      local_70._M_value = _Var18._M_value;
      std::make_unique<tsbp::PackingRelaxed2D,tsbp::PackingRelaxed2D_const&>
                ((PackingRelaxed2D *)local_80);
      AddLeafNode(this,(Node *)&local_90);
      std::unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>::
      ~unique_ptr((unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
                   *)local_80);
      _Var17 = local_58;
      _Var16._M_value = _Var18._M_value;
      if (_Var18._M_value < local_58._M_value) {
        _Var16 = local_58;
      }
      psVar10 = (this->tree).super_type.m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((undefined1 *)
          (((long)(this->tree).super_type.m_vertices.
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar10 >> 4) *
          -0x5555555555555555) <= _Var16._M_value) {
        std::
        vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
        ::resize(pSVar1,(size_type)(_Var16._M_value + 1));
        psVar10 = (pSVar1->
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      }
      local_90._M_value = _Var18._M_value;
      local_88 = operator_new(1);
      std::
      vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>
      ::emplace_back<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>
                ((vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>
                  *)(psVar10 + _Var17._M_value),
                 (stored_edge_property<unsigned_long,_boost::no_property> *)&local_90);
      if (local_88 != (void *)0x0) {
        operator_delete(local_88,1);
      }
      iVar7._M_current =
           (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        this = (TwoStepBranchingProcedure *)&this->activeNodes;
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)this,iVar7,
                   &local_70._M_value);
      }
      else {
        *iVar7._M_current = (unsigned_long)local_70;
        (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      }
      uVar12 = CONCAT71((int7)((ulong)this >> 8),1);
      unaff_R14 = local_70;
      goto LAB_00123cf9;
    }
  }
  uVar12 = 0;
LAB_00123cf9:
  oVar19.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar12 & 0xffffffff;
  oVar19.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = unaff_R14._M_value;
  return (optional<unsigned_long>)
         oVar19.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> TwoStepBranchingProcedure::Branch(size_t nodeId)
{
    Node& currentNode = this->tree[nodeId];
    const boost::dynamic_bitset<>& placedItems = currentNode.PlacedItems();
    ////const std::unordered_set<size_t>& placedItems = currentNode.PlacedItems();

    if (currentNode.NodeStatus == BaseNode::Status::InfeasibleSequence)
    {
        return std::nullopt;
    }

    const PackingRelaxed2D& packing = *currentNode.Packing;

    // Determine number of outgoing edges.
    size_t numberOfOutgoingEdges = boost::out_degree(nodeId, this->tree);
    size_t numberOfRemainingItems = packing.PlaceableItemsAtCurrentX.count();
    ////size_t numberOfRemainingItems = items.size() - placedItems.count();

    // TODO.Logic: currently the DeactivatePlacement node is the last node that is generated. Rework to allow it to be explored in any sequence.
    ////bool isFixedSequenceDeactivation = numberOfOutgoingEdges == 1 && IsFixedSequence(currentNode, -1);
    ////if (numberOfOutgoingEdges == numberOfRemainingItems || isFixedSequenceDeactivation)
    if (numberOfOutgoingEdges == numberOfRemainingItems)
    {
        // AddDeactivatedPlacementNode()
        ////currentNode.Packing.ActiveX = currentNode.Packing.BackupX;
        ////currentNode.Packing.ActiveY = currentNode.Packing.BackupY;

        this->nodesToDeactivate.emplace(nodeId);

        if (currentNode.NodeStatus == BaseNode::Status::Root)
        {
            this->nodesToDeactivate.emplace(0);
            return std::nullopt;
        }

        if (currentNode.NodeType == BaseNode::Type::DeactivatePlacement)
        {
            return std::nullopt;
        }

        typename SearchTree::vertex_descriptor leftNodeId = boost::num_vertices(this->tree);
        AddLeafNode(Node{-1, BaseNode::Type::DeactivatePlacement, BaseNode::Status::NotEvaluated, std::make_unique<PackingRelaxed2D>(packing)});
        boost::add_edge(nodeId, leftNodeId, this->tree);

        // Caution, possible dangling reference to currentNode because the underlying graph might resize on AddLeafNode().
        // TODO.Performance: Consider using std::unique_ptr<Node> to reduce copy effort.

        this->activeNodes.push_back(leftNodeId);

        return leftNodeId;
    }

    typename SearchTree::out_edge_iterator outEdgeIterator;
    typename SearchTree::out_edge_iterator outEdgeEndIterator;
    typename SearchTree::edge_descriptor outEdge;

    boost::dynamic_bitset<> attemptedItemIds(items.size());

    for (boost::tie(outEdgeIterator, outEdgeEndIterator) = boost::out_edges(nodeId, this->tree); outEdgeIterator != outEdgeEndIterator; ++outEdgeIterator)
    {
        outEdge = *outEdgeIterator;
        typename SearchTree::vertex_descriptor targetId = boost::target(outEdge, this->tree);
        const Node& targetNode = this->tree[targetId];

        if (targetNode.ItemIdToPlace >= 0)
        {
            attemptedItemIds.set(targetNode.ItemIdToPlace);
        }
    }

    std::optional<size_t> newNodeId;
    // TODO.Logic: different branching logic, e.g. largest item or deliberately disable placement.
    ////for (size_t i = 0; i < items.size(); i++)
    for (int i: this->branchingOrder)
    {
        ////if (placedItems.contains(i) || attemptedItemIds[i])
        if (placedItems[i] || attemptedItemIds[i] || !packing.PlaceableItemsAtCurrentX[i])
        {
            continue;
        }

        /*
        if (!IsFixedSequence(currentNode, i))
        {
            continue;
        }
        */

        typename SearchTree::vertex_descriptor leftNodeId = boost::num_vertices(this->tree);
        AddLeafNode(Node{(int)i, BaseNode::Type::UsePlacement, BaseNode::Status::NotEvaluated, std::make_unique<PackingRelaxed2D>(packing)});
        boost::add_edge(nodeId, leftNodeId, this->tree);

        // Caution, possible dangling reference to currentNode because the underlying graph might resize on AddLeafNode().

        this->activeNodes.push_back(leftNodeId);
        newNodeId = leftNodeId;

        break;
    }

    return newNodeId;
}